

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::WriteUnitySourceInclude
          (cmLocalGenerator *this,ostream *unity_file,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *cond,string *sf_full_path,cmValue beforeInclude,cmValue afterInclude,cmValue uniqueIdName
          )

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  long *plVar4;
  size_type *psVar5;
  string_view input;
  cmCryptoHash hasher;
  string pathToHash;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string *local_98;
  string local_90;
  char *local_70;
  size_t local_68;
  char local_60;
  undefined7 uStack_5f;
  string local_50;
  
  if ((cond->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    std::__ostream_insert<char,std::char_traits<char>>(unity_file,"#if ",4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (unity_file,
                        (cond->
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_dataplus._M_p,
                        (cond->
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  if ((uniqueIdName.Value == (string *)0x0) || ((uniqueIdName.Value)->_M_string_length == 0))
  goto LAB_0026f3aa;
  local_70 = &local_60;
  local_68 = 0;
  local_60 = '\0';
  local_98 = afterInclude.Value;
  cmsys::SystemTools::GetFilenamePath(&local_50,sf_full_path);
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
  bVar1 = cmsys::SystemTools::ComparePath(&local_50,psVar3);
  if ((bVar1) || (bVar1 = cmsys::SystemTools::IsSubDirectory(&local_50,psVar3), bVar1)) {
    psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
    cmSystemTools::RelativePath(&local_90,psVar3,sf_full_path);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x81a3de);
LAB_0026f1bc:
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_b8.field_2._M_allocated_capacity = *psVar5;
      local_b8.field_2._8_8_ = plVar4[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar5;
      local_b8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_b8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    afterInclude.Value = local_98;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    psVar3 = cmake::GetHomeDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
    bVar1 = cmsys::SystemTools::ComparePath(&local_50,psVar3);
    if ((bVar1) || (bVar1 = cmsys::SystemTools::IsSubDirectory(&local_50,psVar3), bVar1)) {
      psVar3 = cmake::GetHomeDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
      cmSystemTools::RelativePath(&local_90,psVar3,sf_full_path);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x81a3e3);
      goto LAB_0026f1bc;
    }
    std::operator+(&local_b8,"ABS_",sf_full_path);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b8);
    afterInclude.Value = local_98;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      afterInclude.Value = local_98;
    }
  }
  cmCryptoHash::cmCryptoHash((cmCryptoHash *)&local_90,AlgoMD5);
  std::__ostream_insert<char,std::char_traits<char>>(unity_file,"/* ",3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(unity_file,local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," */\n",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"#undef ",7);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,((uniqueIdName.Value)->_M_dataplus)._M_p,
                      (uniqueIdName.Value)->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"#define ",8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,((uniqueIdName.Value)->_M_dataplus)._M_p,
                      (uniqueIdName.Value)->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," unity_",7);
  input._M_str = local_70;
  input._M_len = local_68;
  cmCryptoHash::HashString_abi_cxx11_(&local_b8,(cmCryptoHash *)&local_90,input);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  cmCryptoHash::~cmCryptoHash((cmCryptoHash *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
LAB_0026f3aa:
  if (beforeInclude.Value != (string *)0x0) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (unity_file,((beforeInclude.Value)->_M_dataplus)._M_p,
                        (beforeInclude.Value)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (unity_file,"/* NOLINTNEXTLINE(bugprone-suspicious-include) */\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>(unity_file,"#include \"",10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (unity_file,(sf_full_path->_M_dataplus)._M_p,sf_full_path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
  if (afterInclude.Value != (string *)0x0) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (unity_file,((afterInclude.Value)->_M_dataplus)._M_p,
                        (afterInclude.Value)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  if ((cond->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    std::__ostream_insert<char,std::char_traits<char>>(unity_file,"#endif\n",7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(unity_file,"\n",1);
  return;
}

Assistant:

void cmLocalGenerator::WriteUnitySourceInclude(
  std::ostream& unity_file, cm::optional<std::string> const& cond,
  std::string const& sf_full_path, cmValue beforeInclude, cmValue afterInclude,
  cmValue uniqueIdName) const
{
  if (cond) {
    unity_file << "#if " << *cond << "\n";
  }

  if (cmNonempty(uniqueIdName)) {
    std::string pathToHash;
    auto PathEqOrSubDir = [](std::string const& a, std::string const& b) {
      return (cmSystemTools::ComparePath(a, b) ||
              cmSystemTools::IsSubDirectory(a, b));
    };
    const auto path = cmSystemTools::GetFilenamePath(sf_full_path);
    if (PathEqOrSubDir(path, this->GetBinaryDirectory())) {
      pathToHash = "BLD_" +
        cmSystemTools::RelativePath(this->GetBinaryDirectory(), sf_full_path);
    } else if (PathEqOrSubDir(path, this->GetSourceDirectory())) {
      pathToHash = "SRC_" +
        cmSystemTools::RelativePath(this->GetSourceDirectory(), sf_full_path);
    } else {
      pathToHash = "ABS_" + sf_full_path;
    }
    cmCryptoHash hasher(cmCryptoHash::AlgoMD5);
    unity_file << "/* " << pathToHash << " */\n"
               << "#undef " << *uniqueIdName << "\n"
               << "#define " << *uniqueIdName << " unity_"
               << hasher.HashString(pathToHash) << "\n";
  }

  if (beforeInclude) {
    unity_file << *beforeInclude << "\n";
  }

  unity_file << "/* NOLINTNEXTLINE(bugprone-suspicious-include) */\n";
  unity_file << "#include \"" << sf_full_path << "\"\n";

  if (afterInclude) {
    unity_file << *afterInclude << "\n";
  }
  if (cond) {
    unity_file << "#endif\n";
  }
  unity_file << "\n";
}